

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.h
# Opt level: O0

uint8_t * ptls_encode_quicint(uint8_t *p,uint64_t v)

{
  uint64_t uVar1;
  int local_1c;
  uint sb;
  uint64_t v_local;
  uint8_t *p_local;
  
  v_local = (uint64_t)p;
  if (0x3f < v) {
    if (v < 0x4000) {
      *p = (byte)(v >> 8) | 0x40;
      v_local = (uint64_t)(p + 1);
    }
    else {
      if (v < 0x40000000) {
        *p = (byte)(v >> 0x18) | 0x80;
        local_1c = 0x10;
      }
      else {
        if (0x3fffffffffffffff < v) {
          __assert_fail("v <= 4611686018427387903",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/include/picotls.h"
                        ,0x541,"uint8_t *ptls_encode_quicint(uint8_t *, uint64_t)");
        }
        *p = (byte)(v >> 0x38) | 0xc0;
        local_1c = 0x30;
      }
      v_local = (long)p + 1;
      do {
        uVar1 = v_local + 1;
        *(char *)v_local = (char)(v >> ((byte)local_1c & 0x3f));
        local_1c = local_1c + -8;
        v_local = uVar1;
      } while (local_1c != 0);
    }
  }
  *(char *)v_local = (char)v;
  return (uint8_t *)(v_local + 1);
}

Assistant:

inline uint8_t *ptls_encode_quicint(uint8_t *p, uint64_t v)
{
    if (PTLS_UNLIKELY(v > 63)) {
        if (PTLS_UNLIKELY(v > 16383)) {
            unsigned sb;
            if (PTLS_UNLIKELY(v > 1073741823)) {
                assert(v <= 4611686018427387903);
                *p++ = 0xc0 | (uint8_t)(v >> 56);
                sb = 6 * 8;
            } else {
                *p++ = 0x80 | (uint8_t)(v >> 24);
                sb = 2 * 8;
            }
            do {
                *p++ = (uint8_t)(v >> sb);
            } while ((sb -= 8) != 0);
        } else {
            *p++ = 0x40 | (uint8_t)((uint16_t)v >> 8);
        }
    }
    *p++ = (uint8_t)v;
    return p;
}